

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSender.cpp
# Opt level: O1

void __thiscall MyServerConnection::StartSending(MyServerConnection *this)

{
  ostringstream *poVar1;
  MyServer *pMVar2;
  TonkFile pTVar3;
  OutputWorker *pOVar4;
  undefined1 local_1a0 [392];
  
  pTVar3 = tonk_file_from_disk((this->super_SDKConnection).MyConnection,0x96,
                               (this->Server->FileSendName)._M_dataplus._M_p,
                               (this->Server->FileSendPath)._M_dataplus._M_p);
  this->File = pTVar3;
  pMVar2 = this->Server;
  if (pTVar3 == (TonkFile)0x0) {
    if ((int)Logger.ChannelMinLevel < 5) {
      poVar1 = (ostringstream *)(local_1a0 + 0x10);
      local_1a0._0_8_ = Logger.ChannelName;
      local_1a0._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Failed to map source file ",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(pMVar2->FileSendPath)._M_dataplus._M_p,
                 (pMVar2->FileSendPath)._M_string_length);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1a0);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
  }
  else {
    if ((int)Logger.ChannelMinLevel < 2) {
      poVar1 = (ostringstream *)(local_1a0 + 0x10);
      local_1a0._0_8_ = Logger.ChannelName;
      local_1a0._8_4_ = Debug;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Successfully mapped ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(pMVar2->FileSendPath)._M_dataplus._M_p,
                 (pMVar2->FileSendPath)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," for file data",0xe);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1a0);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    tonk_file_send(this->File);
  }
  return;
}

Assistant:

void MyServerConnection::StartSending()
{
    File = tonk_file_from_disk(
        GetRawConnection(),
        TonkChannel_LowPri0,
        Server->FileSendName.c_str(),
        Server->FileSendPath.c_str());

    if (File == nullptr) {
        Logger.Error("Failed to map source file ", Server->FileSendPath);
        return;
    }

    Logger.Debug("Successfully mapped ", Server->FileSendPath, " for file data");

    tonk_file_send(File);
}